

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnviewgrip.cpp
# Opt level: O0

void __thiscall QColumnViewGrip::mousePressEvent(QColumnViewGrip *this,QMouseEvent *event)

{
  long lVar1;
  QEvent *this_00;
  uint uVar2;
  QColumnViewGripPrivate *pQVar3;
  sockaddr *__addr;
  int in_ESI;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QPointF QVar4;
  QColumnViewGripPrivate *d;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QEvent *)CONCAT44(in_register_00000034,in_ESI);
  pQVar3 = d_func((QColumnViewGrip *)0x86f87a);
  QVar4 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0x86f888);
  QPointF::toPoint((QPointF *)QVar4.xp);
  uVar2 = QPoint::x((QPoint *)0x86f8ad);
  *(uint *)&(pQVar3->super_QWidgetPrivate).field_0x254 = uVar2;
  QEvent::accept(this_00,in_ESI,__addr,(socklen_t *)(ulong)uVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColumnViewGrip::mousePressEvent(QMouseEvent *event)
{
    Q_D(QColumnViewGrip);
    d->originalXLocation = event->globalPosition().toPoint().x();
    event->accept();
}